

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(QPDFOutlineDocumentHelper *this,QPDF *qpdf)

{
  _Rb_tree_header *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *this_00;
  undefined8 this_01;
  undefined8 uVar3;
  bool bVar4;
  Members *__p;
  QPDFObjGen og;
  _Rb_tree_header *p_Var5;
  QPDFObjectHandle outlines;
  QPDFObjectHandle root;
  set seen;
  QPDFOutlineObjectHelper local_f0;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_60;
  
  (this->super_QPDFDocumentHelper).qpdf = qpdf;
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFOutlineDocumentHelper_002ebbc0;
  __p = (Members *)operator_new(0x98);
  p_Var1 = &(__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
            _M_t._M_impl.super__Rb_tree_header;
  (__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__p->names_dest).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&(__p->by_page)._M_t._M_impl = 0;
  (__p->dest_dict).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->names_dest).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
  .super__Rb_tree_header._M_node_count = 0;
  (__p->dest_dict).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  *(undefined8 *)
   &(__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header = 0;
  (__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->outlines).
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   &(__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
    _M_impl = 0;
  (__p->outlines).
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->outlines).
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)&(__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var5 = &(__p->by_page)._M_t._M_impl.super__Rb_tree_header;
  (__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p->names_dest).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  (__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  (__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m).super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFOutlineDocumentHelper::Members*>
            (&(this->m).
              super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  QPDF::getRoot((QPDF *)&local_88);
  p_Var2 = &local_f0.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/Outlines","");
  bVar4 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_88,(string *)&local_f0);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var2) {
    operator_delete(local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_f0.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (bVar4) {
    local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/Outlines","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_b8 + 0x10),&local_88);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var2) {
      operator_delete(local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_f0.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_b8 + 0x10));
    if (bVar4) {
      local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/First","");
      bVar4 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)(local_b8 + 0x10),(string *)&local_f0);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var2) {
        operator_delete(local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_f0.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      if (bVar4) {
        local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/First","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_b8,(string *)(local_b8 + 0x10));
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var2) {
          operator_delete(local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)&(local_f0.super_QPDFObjectHelper.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          bVar4 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_b8);
          if (bVar4) break;
          og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_b8);
          bVar4 = QPDFObjGen::set::add((set *)&local_60,og);
          if (!bVar4) break;
          this_00 = (this->m).
                    super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_98._M_allocated_capacity = local_b8._0_8_;
          local_98._8_8_ = local_b8._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
            }
          }
          QPDFOutlineObjectHelper::Accessor::create(&local_f0,(QPDFObjectHandle *)&local_98,this,1);
          std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::
          emplace_back<QPDFOutlineObjectHelper>(&this_00->outlines,&local_f0);
          QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(&local_f0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
          }
          local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/Next","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_88.field_2,(string *)local_b8);
          uVar3 = local_88.field_2._8_8_;
          local_b8._0_8_ = local_88.field_2._M_allocated_capacity;
          this_01 = local_b8._8_8_;
          local_88.field_2._M_allocated_capacity = 0;
          local_88.field_2._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_b8._8_8_ = uVar3;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.field_2._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.field_2._8_8_);
            }
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var2) {
            operator_delete(local_f0.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (ulong)((long)&(local_f0.super_QPDFObjectHelper.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
        }
        std::
        _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
        ::~_Rb_tree(&local_60);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._24_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
  }
  return;
}

Assistant:

QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    QPDFObjectHandle root = qpdf.getRoot();
    if (!root.hasKey("/Outlines")) {
        return;
    }
    QPDFObjectHandle outlines = root.getKey("/Outlines");
    if (!(outlines.isDictionary() && outlines.hasKey("/First"))) {
        return;
    }
    QPDFObjectHandle cur = outlines.getKey("/First");
    QPDFObjGen::set seen;
    while (!cur.isNull() && seen.add(cur)) {
        m->outlines.push_back(QPDFOutlineObjectHelper::Accessor::create(cur, *this, 1));
        cur = cur.getKey("/Next");
    }
}